

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

int run_test_getsockname_udp(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  size_t __size;
  undefined8 uVar8;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr sockname;
  sockaddr_in addr;
  int namelen;
  
  loop = uv_default_loop();
  iVar3 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_a = (int64_t)iVar3;
  if (eval_a == 0) {
    iVar3 = uv_udp_init(loop,&udpServer);
    if (iVar3 != 0) {
      pcVar6 = "Socket creation error\n";
      __size = 0x16;
LAB_0013f64d:
      fwrite(pcVar6,__size,1,_stderr);
      return 1;
    }
    iVar3 = uv_udp_bind(&udpServer,(sockaddr *)&addr,0);
    if (iVar3 != 0) {
      pcVar6 = "Bind error\n";
      __size = 0xb;
      goto LAB_0013f64d;
    }
    sockname.sa_data[6] = -1;
    sockname.sa_data[7] = -1;
    sockname.sa_data[8] = -1;
    sockname.sa_data[9] = -1;
    sockname.sa_family = 0xffff;
    sockname.sa_data[0] = -1;
    sockname.sa_data[1] = -1;
    sockname.sa_data[2] = -1;
    sockname.sa_data[3] = -1;
    sockname.sa_data[4] = -1;
    sockname.sa_data[5] = -1;
    sockname.sa_data[10] = -1;
    sockname.sa_data[0xb] = -1;
    sockname.sa_data[0xc] = -1;
    sockname.sa_data[0xd] = -1;
    namelen = 0x10;
    iVar3 = uv_udp_getsockname(&udpServer,&sockname,&namelen);
    eval_a = (int64_t)iVar3;
    if (eval_a == 0) {
      check_sockname(&sockname,"0.0.0.0",0x23a3,"udp listener socket");
      getsocknamecount_udp = getsocknamecount_udp + 1;
      iVar3 = uv_udp_recv_start(&udpServer,alloc,udp_recv);
      eval_a = (int64_t)iVar3;
      if (eval_a == 0) {
        iVar3 = uv_udp_init(loop,&udp);
        if (iVar3 != 0) {
          uVar5 = 0x138;
LAB_0013f789:
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
                  ,uVar5,"!r");
          abort();
        }
        sockname = (sockaddr)uv_buf_init("PING",4);
        iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
        eval_a = (int64_t)iVar3;
        if (eval_a == 0) {
          iVar3 = uv_udp_send(&send_req,&udp,(uv_buf_t *)&sockname,1,(sockaddr *)&addr,udp_send);
          if (iVar3 != 0) {
            uVar5 = 0x143;
            goto LAB_0013f789;
          }
          uv_run(loop,UV_RUN_DEFAULT);
          addr.sin_family = 2;
          addr.sin_port = 0;
          addr.sin_addr.s_addr = 0;
          lVar4 = (long)getsocknamecount_udp;
          uVar5 = sockname.sa_data._6_8_;
          sockname.sa_family = (short)lVar4;
          sockname.sa_data[0] = (char)((ulong)lVar4 >> 0x10);
          sockname.sa_data[1] = (char)((ulong)lVar4 >> 0x18);
          sockname.sa_data[2] = (char)((ulong)lVar4 >> 0x20);
          sockname.sa_data[3] = (char)((ulong)lVar4 >> 0x28);
          sockname.sa_data[4] = (char)((ulong)lVar4 >> 0x30);
          sockname.sa_data[5] = (char)((ulong)lVar4 >> 0x38);
          if (lVar4 == 2) {
            addr.sin_family = (undefined2)udp.send_queue_size;
            addr.sin_port = udp.send_queue_size._2_2_;
            addr.sin_addr.s_addr = udp.send_queue_size._4_4_;
            auVar1._8_8_ = 0;
            auVar1[0] = sockname.sa_data[6];
            auVar1[1] = sockname.sa_data[7];
            auVar1[2] = sockname.sa_data[8];
            auVar1[3] = sockname.sa_data[9];
            auVar1[4] = sockname.sa_data[10];
            auVar1[5] = sockname.sa_data[0xb];
            auVar1[6] = sockname.sa_data[0xc];
            auVar1[7] = sockname.sa_data[0xd];
            sockname = (sockaddr)(auVar1 << 0x40);
            if (udp.send_queue_size == 0) {
              addr.sin_family = (undefined2)udpServer.send_queue_size;
              addr.sin_port = udpServer.send_queue_size._2_2_;
              addr.sin_addr.s_addr = udpServer.send_queue_size._4_4_;
              auVar2._8_8_ = 0;
              sockname.sa_data[6] = (char)uVar5;
              sockname.sa_data[7] = SUB81(uVar5,1);
              sockname.sa_data[8] = SUB81(uVar5,2);
              sockname.sa_data[9] = SUB81(uVar5,3);
              sockname.sa_data[10] = SUB81(uVar5,4);
              sockname.sa_data[0xb] = SUB81(uVar5,5);
              sockname.sa_data[0xc] = SUB81(uVar5,6);
              sockname.sa_data[0xd] = SUB81(uVar5,7);
              auVar2[0] = sockname.sa_data[6];
              auVar2[1] = sockname.sa_data[7];
              auVar2[2] = sockname.sa_data[8];
              auVar2[3] = sockname.sa_data[9];
              auVar2[4] = sockname.sa_data[10];
              auVar2[5] = sockname.sa_data[0xb];
              auVar2[6] = sockname.sa_data[0xc];
              auVar2[7] = sockname.sa_data[0xd];
              sockname = (sockaddr)(auVar2 << 0x40);
              if (udpServer.send_queue_size == 0) {
                close_loop(loop);
                addr.sin_family = 0;
                addr.sin_port = 0;
                addr.sin_addr.s_addr = 0;
                iVar3 = uv_loop_close(loop);
                lVar4 = (long)iVar3;
                sockname.sa_family = (short)lVar4;
                sockname.sa_data[0] = (char)((ulong)lVar4 >> 0x10);
                sockname.sa_data[1] = (char)((ulong)lVar4 >> 0x18);
                sockname.sa_data[2] = (char)((ulong)lVar4 >> 0x20);
                sockname.sa_data[3] = (char)((ulong)lVar4 >> 0x28);
                sockname.sa_data[4] = (char)((ulong)lVar4 >> 0x30);
                sockname.sa_data[5] = (char)((ulong)lVar4 >> 0x38);
                if (addr._0_8_ == lVar4) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar7 = "uv_loop_close(loop)";
                pcVar6 = "0";
                uVar5 = 0x168;
              }
              else {
                pcVar7 = "0";
                pcVar6 = "udpServer.send_queue_size";
                uVar5 = 0x166;
              }
            }
            else {
              pcVar7 = "0";
              pcVar6 = "udp.send_queue_size";
              uVar5 = 0x165;
            }
          }
          else {
            pcVar7 = "getsocknamecount_udp";
            pcVar6 = "2";
            uVar5 = 0x163;
          }
          eval_a = addr._0_8_;
          uVar8 = sockname._0_8_;
          goto LAB_0013f872;
        }
        pcVar6 = "uv_ip4_addr(\"127.0.0.1\", server_port, &server_addr)";
        uVar5 = 0x13b;
      }
      else {
        pcVar6 = "r";
        uVar5 = 300;
      }
    }
    else {
      pcVar6 = "r";
      uVar5 = 0x127;
    }
  }
  else {
    pcVar6 = "uv_ip4_addr(\"0.0.0.0\", server_port, &addr)";
    uVar5 = 0x116;
  }
  pcVar7 = "0";
  uVar8._0_2_ = 0;
  uVar8._2_1_ = '\0';
  uVar8._3_1_ = '\0';
  uVar8._4_1_ = '\0';
  uVar8._5_1_ = '\0';
  uVar8._6_1_ = '\0';
  uVar8._7_1_ = '\0';
LAB_0013f872:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
          ,uVar5,pcVar6,"==",pcVar7,eval_a,"==",uVar8);
  abort();
}

Assistant:

TEST_IMPL(getsockname_udp) {
  loop = uv_default_loop();

  if (udp_listener())
    return 1;

  udp_sender();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(2, getsocknamecount_udp);

  ASSERT_OK(udp.send_queue_size);
  ASSERT_OK(udpServer.send_queue_size);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}